

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_debug.c
# Opt level: O1

TValue * debug_localname(lua_State *L,lua_Debug *ar,char **name,BCReg slot1)

{
  TValue *pTVar1;
  bool bVar2;
  BCPos pc;
  char *pcVar3;
  TValue *pTVar4;
  ulong uVar5;
  TValue *pTVar6;
  uint uVar7;
  GCfunc *fn;
  TValue *nextframe;
  
  uVar7 = ar->i_ci;
  pTVar1 = (TValue *)((L->stack).ptr64 + (ulong)(uVar7 & 0xffff) * 8);
  nextframe = (cTValue *)0x0;
  if (0xffff < uVar7) {
    nextframe = pTVar1 + (uVar7 >> 0x10);
  }
  fn = (GCfunc *)(pTVar1[-1].u64 & 0x7fffffffffff);
  pc = debug_framepc(L,fn,nextframe);
  if (nextframe == (cTValue *)0x0) {
    nextframe = L->top + 1;
  }
  if ((int)slot1 < 0) {
    if (pc != 0xffffffff) {
      pTVar4 = (TValue *)(fn->c).pc.ptr64;
      bVar2 = true;
      if (((ulong)*pTVar4 & 0x20000000000) != 0) {
        uVar5 = (ulong)(*(byte *)((long)pTVar4 + -0x5e) - slot1);
        uVar7 = (pTVar1->u32).lo & 7;
        pTVar4 = (TValue *)-((ulong)pTVar1->u32 & 0xfffffffffffffff8);
        if (uVar7 == 3) {
          nextframe = pTVar1;
        }
        pTVar6 = (TValue *)0x0;
        if (uVar7 == 3) {
          pTVar6 = pTVar4;
        }
        if ((TValue *)((long)pTVar6 + (long)pTVar1 + uVar5 * 8 + 8) < nextframe) {
          pTVar4 = (TValue *)((long)pTVar6 + (long)pTVar1 + uVar5 * 8);
          *name = "(*vararg)";
          bVar2 = false;
        }
      }
      if (!bVar2) {
        return pTVar4;
      }
    }
    return (TValue *)0x0;
  }
  if (pc == 0xffffffff) {
    if (slot1 == 0) goto code_r0x0010d084;
  }
  else {
    pcVar3 = debug_varname((GCproto *)((fn->c).pc.ptr64 - 0x68),pc,slot1 - 1);
    *name = pcVar3;
    if ((slot1 == 0) || (pcVar3 != (char *)0x0)) goto code_r0x0010d084;
  }
  if (pTVar1 + (ulong)slot1 + 1 < nextframe) {
    *name = "(*temporary)";
  }
code_r0x0010d084:
  return pTVar1 + slot1;
}

Assistant:

static TValue *debug_localname(lua_State *L, const lua_Debug *ar,
			       const char **name, BCReg slot1)
{
  uint32_t offset = (uint32_t)ar->i_ci & 0xffff;
  uint32_t size = (uint32_t)ar->i_ci >> 16;
  TValue *frame = tvref(L->stack) + offset;
  TValue *nextframe = size ? frame + size : NULL;
  GCfunc *fn = frame_func(frame);
  BCPos pc = debug_framepc(L, fn, nextframe);
  if (!nextframe) nextframe = L->top+LJ_FR2;
  if ((int)slot1 < 0) {  /* Negative slot number is for varargs. */
    if (pc != NO_BCPOS) {
      GCproto *pt = funcproto(fn);
      if ((pt->flags & PROTO_VARARG)) {
	slot1 = pt->numparams + (BCReg)(-(int)slot1);
	if (frame_isvarg(frame)) {  /* Vararg frame has been set up? (pc!=0) */
	  nextframe = frame;
	  frame = frame_prevd(frame);
	}
	if (frame + slot1+LJ_FR2 < nextframe) {
	  *name = "(*vararg)";
	  return frame+slot1;
	}
      }
    }
    return NULL;
  }
  if (pc != NO_BCPOS &&
      (*name = debug_varname(funcproto(fn), pc, slot1-1)) != NULL)
    ;
  else if (slot1 > 0 && frame + slot1+LJ_FR2 < nextframe)
    *name = "(*temporary)";
  return frame+slot1;
}